

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O2

void __thiscall Assignment::~Assignment(Assignment *this)

{
  BinaryOperator::~BinaryOperator(&this->super_BinaryOperator);
  operator_delete(this,0x38);
  return;
}

Assistant:

Assignment(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right) : BinaryOperator(operation, left, right) { }